

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

Link * __thiscall
DistanceGraph::get_link
          (Link *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  pointer pvVar1;
  pointer pLVar2;
  pointer pLVar3;
  sgNodeID_t sVar4;
  int32_t iVar5;
  undefined4 uVar6;
  SupportType SVar7;
  undefined1 uVar8;
  uint16_t uVar9;
  undefined4 uVar10;
  pointer pLVar11;
  long lVar12;
  bool bVar13;
  
  lVar12 = -source;
  if (0 < source) {
    lVar12 = source;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = pvVar1[lVar12].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = *(pointer *)
            ((long)&pvVar1[lVar12].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data + 8);
  bVar13 = pLVar2 == pLVar3;
  if (!bVar13) {
    sVar4 = pLVar2->dest;
    iVar5 = pLVar2->dist;
    uVar6 = *(undefined4 *)&pLVar2->field_0x14;
    SVar7 = (pLVar2->support).type;
    uVar8 = (pLVar2->support).field_0x1;
    uVar9 = (pLVar2->support).index;
    uVar10 = *(undefined4 *)&(pLVar2->support).field_0x4;
    __return_storage_ptr__->source = pLVar2->source;
    __return_storage_ptr__->dest = sVar4;
    (__return_storage_ptr__->support).id = (pLVar2->support).id;
    __return_storage_ptr__->dist = iVar5;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar6;
    (__return_storage_ptr__->support).type = SVar7;
    (__return_storage_ptr__->support).field_0x1 = uVar8;
    (__return_storage_ptr__->support).index = uVar9;
    *(undefined4 *)&(__return_storage_ptr__->support).field_0x4 = uVar10;
    lVar12 = __return_storage_ptr__->dest;
    while (lVar12 != dest) {
      pLVar11 = pLVar2 + 1;
      bVar13 = pLVar11 == pLVar3;
      if (bVar13) goto LAB_0017b6c3;
      sVar4 = pLVar2[1].dest;
      iVar5 = pLVar2[1].dist;
      uVar6 = *(undefined4 *)&pLVar2[1].field_0x14;
      SVar7 = pLVar2[1].support.type;
      uVar8 = pLVar2[1].support.field_0x1;
      uVar9 = pLVar2[1].support.index;
      uVar10 = *(undefined4 *)&pLVar2[1].support.field_0x4;
      __return_storage_ptr__->source = pLVar11->source;
      __return_storage_ptr__->dest = sVar4;
      (__return_storage_ptr__->support).id = pLVar2[1].support.id;
      __return_storage_ptr__->dist = iVar5;
      *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar6;
      (__return_storage_ptr__->support).type = SVar7;
      (__return_storage_ptr__->support).field_0x1 = uVar8;
      (__return_storage_ptr__->support).index = uVar9;
      *(undefined4 *)&(__return_storage_ptr__->support).field_0x4 = uVar10;
      pLVar2 = pLVar11;
      lVar12 = __return_storage_ptr__->dest;
    }
    if (!bVar13) {
      return __return_storage_ptr__;
    }
  }
LAB_0017b6c3:
  __return_storage_ptr__->source = 0;
  __return_storage_ptr__->dest = 0;
  __return_storage_ptr__->dist = 0;
  (__return_storage_ptr__->support).type = Undefined;
  (__return_storage_ptr__->support).field_0x1 = 0;
  (__return_storage_ptr__->support).index = 0;
  *(undefined4 *)&(__return_storage_ptr__->support).field_0x4 = 0;
  (__return_storage_ptr__->support).id = 0;
  return __return_storage_ptr__;
}

Assistant:

Link DistanceGraph::get_link(sgNodeID_t source, sgNodeID_t dest) {
    for (auto l:links[(source > 0 ? source : -source)]) {
        if (l.source==source,l.dest==dest) return l;
    }
    return Link(0,0,0);
}